

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_64bit_generated.h
# Opt level: O1

bool __thiscall WrapperTable::Verify(WrapperTable *this,Verifier *verifier)

{
  bool bVar1;
  ushort uVar2;
  WrapperTable *vec;
  
  bVar1 = flatbuffers::VerifierTemplate<false>::VerifyTableStart(verifier,(uint8_t *)this);
  if ((!bVar1) ||
     (bVar1 = flatbuffers::Table::VerifyOffset<unsigned_long>(&this->super_Table,verifier,4), !bVar1
     )) {
    return false;
  }
  if (*(ushort *)(this + -(long)*(int *)this) < 5) {
    uVar2 = 0;
  }
  else {
    uVar2 = *(ushort *)(this + (4 - (long)*(int *)this));
  }
  if (uVar2 == 0) {
    vec = (WrapperTable *)0x0;
  }
  else {
    vec = this + *(long *)(this + uVar2) + (ulong)uVar2;
  }
  if ((vec != (WrapperTable *)0x0) &&
     (bVar1 = flatbuffers::VerifierTemplate<false>::VerifyVectorOrString<unsigned_int>
                        (verifier,(uint8_t *)vec,1,(size_t *)0x0), !bVar1)) {
    return false;
  }
  verifier->depth_ = verifier->depth_ - 1;
  return true;
}

Assistant:

bool Verify(::flatbuffers::Verifier &verifier) const {
    return VerifyTableStart(verifier) &&
           VerifyOffset64(verifier, VT_VECTOR) &&
           verifier.VerifyVector(vector()) &&
           verifier.EndTable();
  }